

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O0

bool __thiscall IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo(PropertySymOpnd *this)

{
  bool bVar1;
  PropertySymOpnd *this_local;
  
  bVar1 = HasObjTypeSpecFldInfo(this);
  if (((!bVar1) || (bVar1 = IsPoly(this), !bVar1)) ||
     ((bVar1 = DoesntHaveEquivalence(this), !bVar1 && (bVar1 = IsLoadedFromProto(this), bVar1)))) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ShouldResetObjTypeSpecFldInfo()
    {
        // If an objTypeSpecFldInfo was created just for the purpose of polymorphic inlining but didn't get used for the same (for some reason or the other), and the polymorphic cache it was created from, wasn't equivalent,
        // we should null out this info on the propertySymOpnd so that assumptions downstream around equivalent object type spec still hold.
        if (HasObjTypeSpecFldInfo() && IsPoly() && (DoesntHaveEquivalence() || !IsLoadedFromProto()))
        {
            return true;
        }
        return false;
    }